

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<int_const&>*,std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>>
          (ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&>
           *this,__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
          last)

{
  bool bVar1;
  testing *this_00;
  Matcher<const_int_&> *matcher;
  __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
  local_40;
  Matcher<const_int_&> local_38;
  ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&> *local_20
  ;
  ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>
  *this_local;
  __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
  last_local;
  __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
  first_local;
  
  local_20 = this;
  this_local = (ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>
                *)last._M_current;
  last_local = first;
  MatcherInterface<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>::
  MatcherInterface((MatcherInterface<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>
                    *)this);
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_0079cbb0;
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  vector((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_> *)
         (this + 8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
                        *)&this_local);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
               ::operator++(&last_local,0);
    this_00 = (testing *)
              __gnu_cxx::
              __normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
              ::operator*(&local_40);
    MatcherCast<int_const&,testing::Matcher<int_const&>>(&local_38,this_00,matcher);
    std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
    push_back((vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               *)(this + 8),&local_38);
    Matcher<const_int_&>::~Matcher(&local_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }